

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O1

Expression __thiscall dynet::RNNBuilder::add_input(RNNBuilder *this,Expression *x)

{
  undefined4 uVar1;
  iterator __position;
  Expression EVar2;
  
  RNNStateMachine::transition((RNNStateMachine *)(this + 0x10),add_input);
  __position._M_current = *(int **)(this + 0x20);
  if (__position._M_current == *(int **)(this + 0x28)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)(this + 0x18),__position,(int *)(this + 8));
  }
  else {
    *__position._M_current = *(int *)(this + 8);
    *(int **)(this + 0x20) = __position._M_current + 1;
  }
  uVar1 = *(undefined4 *)(this + 8);
  *(int *)(this + 8) = (int)((ulong)(*(long *)(this + 0x20) - *(long *)(this + 0x18)) >> 2) + -1;
  EVar2 = (Expression)(**(code **)(*(long *)this + 0x60))(this,uVar1,x);
  return EVar2;
}

Assistant:

Expression add_input(const Expression& x) {
    sm.transition(RNNOp::add_input);
    head.push_back(cur);
    int rcp = cur;
    cur = head.size() - 1;
    return add_input_impl(rcp, x);
  }